

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

void nghttp2_hd_inflate_free(nghttp2_hd_inflater *inflater)

{
  nghttp2_hd_inflater *inflater_local;
  
  hd_inflate_keep_free(inflater);
  nghttp2_rcbuf_decref(inflater->valuercbuf);
  nghttp2_rcbuf_decref(inflater->namercbuf);
  hd_context_free(&inflater->ctx);
  return;
}

Assistant:

void nghttp2_hd_inflate_free(nghttp2_hd_inflater *inflater) {
  hd_inflate_keep_free(inflater);

  nghttp2_rcbuf_decref(inflater->valuercbuf);
  nghttp2_rcbuf_decref(inflater->namercbuf);

  hd_context_free(&inflater->ctx);
}